

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_check_collision_circle_rec(rf_vec2 center,float radius,rf_rec rec)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = rec.width * 0.5;
  fVar4 = ABS(center.x - (float)(int)(rec.x + fVar5));
  bVar1 = false;
  if (fVar4 <= fVar5 + radius) {
    fVar3 = rec.height * 0.5;
    fVar2 = ABS(center.y - (float)(int)(rec.y + fVar3));
    bVar1 = false;
    if (((fVar2 <= fVar3 + radius) && (bVar1 = true, fVar5 < fVar4)) && (fVar3 < fVar2)) {
      bVar1 = (fVar4 - fVar5) * (fVar4 - fVar5) + (fVar2 - fVar3) * (fVar2 - fVar3) <=
              radius * radius;
    }
  }
  return bVar1;
}

Assistant:

bool rf_check_collision_circle_rec(rf_vec2 center, float radius, rf_rec rec)
{
    int recCenterX = (int) (rec.x + rec.width / 2.0f);
    int recCenterY = (int) (rec.y + rec.height / 2.0f);

    float dx = (float) fabs(center.x - recCenterX);
    float dy = (float) fabs(center.y - recCenterY);

    if (dx > (rec.width / 2.0f + radius))
    { return 0; }
    if (dy > (rec.height / 2.0f + radius))
    { return 0; }

    if (dx <= (rec.width / 2.0f))
    { return 1; }
    if (dy <= (rec.height / 2.0f))
    { return 1; }

    float cornerDistanceSq = (dx - rec.width / 2.0f) * (dx - rec.width / 2.0f) +
                             (dy - rec.height / 2.0f) * (dy - rec.height / 2.0f);

    return (cornerDistanceSq <= (radius * radius));
}